

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

ly_bool lysp_schema_nodeid_match
                  (lysc_nodeid *nodeid,lysp_module *nodeid_pmod,lysp_ext_instance *nodeid_ext,
                  lysc_node *ctx_node,lysc_node *parent,lysp_node *pnode,lys_module *pnode_mod,
                  lysc_ext_instance *pnode_ext)

{
  lys_module *plVar1;
  ulong uVar2;
  bool bVar3;
  
  if ((pnode_ext == (lysc_ext_instance *)0x0) == (nodeid_ext == (lysp_ext_instance *)0x0)) {
    uVar2 = (ulong)(nodeid->count - 1);
    plVar1 = lys_schema_node_get_module(nodeid_pmod->mod->ctx,nodeid->prefix[uVar2],nodeid_pmod);
    if (plVar1 == (lys_module *)0x0) {
      __assert_fail("mod",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                    ,0x699,
                    "ly_bool lysp_schema_nodeid_match(const struct lysc_nodeid *, const struct lysp_module *, const struct lysp_ext_instance *, const struct lysc_node *, const struct lysc_node *, const struct lysp_node *, const struct lys_module *, const struct lysc_ext_instance *)"
                   );
    }
    if (pnode == (lysp_node *)0x0) {
      bVar3 = true;
      if ((parent->module == plVar1) && (parent->name == nodeid->name[uVar2])) {
        parent = parent->parent;
        bVar3 = false;
      }
      if (bVar3) {
        return '\0';
      }
    }
    else {
      if (plVar1 != pnode_mod) {
        return '\0';
      }
      if (pnode->name != nodeid->name[uVar2]) {
        return '\0';
      }
    }
    for (; uVar2 != 0; uVar2 = uVar2 - 1) {
      if (parent == (lysc_node *)0x0 && pnode_ext == (lysc_ext_instance *)0x0) {
        return '\0';
      }
      plVar1 = lys_schema_node_get_module
                         (nodeid_pmod->mod->ctx,nodeid->prefix[uVar2 - 1],nodeid_pmod);
      if (plVar1 == (lys_module *)0x0) {
        __assert_fail("mod",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                      ,0x6b2,
                      "ly_bool lysp_schema_nodeid_match(const struct lysc_nodeid *, const struct lysp_module *, const struct lysp_ext_instance *, const struct lysc_node *, const struct lysc_node *, const struct lysp_node *, const struct lys_module *, const struct lysc_ext_instance *)"
                     );
      }
      if (parent == (lysc_node *)0x0) {
        bVar3 = true;
        if ((pnode_ext->module == plVar1) &&
           (bVar3 = pnode_ext->argument != nodeid->name[uVar2 - 1], !bVar3)) {
          pnode_ext = (lysc_ext_instance *)0x0;
        }
        if (bVar3) {
          return '\0';
        }
      }
      else {
        bVar3 = true;
        if ((parent->module == plVar1) && (parent->name == nodeid->name[uVar2 - 1])) {
          parent = parent->parent;
          bVar3 = false;
        }
        if (bVar3) {
          return '\0';
        }
      }
    }
    if (((ctx_node == (lysc_node *)0x0) || (parent == ctx_node)) &&
       ((ctx_node != (lysc_node *)0x0 ||
        (parent == (lysc_node *)0x0 && pnode_ext == (lysc_ext_instance *)0x0)))) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

static ly_bool
lysp_schema_nodeid_match(const struct lysc_nodeid *nodeid, const struct lysp_module *nodeid_pmod,
        const struct lysp_ext_instance *nodeid_ext, const struct lysc_node *ctx_node, const struct lysc_node *parent,
        const struct lysp_node *pnode, const struct lys_module *pnode_mod, const struct lysc_ext_instance *pnode_ext)
{
    uint32_t i;
    const struct lys_module *mod;

    if (nodeid_ext && !pnode_ext) {
        /* extension instance augment and standard node, will never match */
        return 0;
    } else if (!nodeid_ext && pnode_ext) {
        /* standard augment and extension instance node, will never match */
        return 0;
    }

    /* compare last node in the node ID */
    i = nodeid->count - 1;

    /* get exp node ID module */
    mod = lys_schema_node_get_module(nodeid_pmod->mod->ctx, nodeid->prefix[i], nodeid_pmod);
    assert(mod);

    if (pnode) {
        /* compare on the last parsed-only node */
        if ((pnode_mod != mod) || (pnode->name != nodeid->name[i])) {
            return 0;
        }
    } else {
        /* using parent directly */
        if (!lysp_schema_nodeid_match_node(&parent, mod, nodeid->name[i])) {
            return 0;
        }
    }

    /* now compare all the compiled parents */
    while (i) {
        --i;

        if (!parent && !pnode_ext) {
            /* no more parents but path continues */
            return 0;
        }

        /* get exp node ID module */
        mod = lys_schema_node_get_module(nodeid_pmod->mod->ctx, nodeid->prefix[i], nodeid_pmod);
        assert(mod);

        if (parent) {
            /* compare with the parent */
            if (!lysp_schema_nodeid_match_node(&parent, mod, nodeid->name[i])) {
                return 0;
            }
        } else {
            /* compare with the ext instance */
            if (!lysp_schema_nodeid_match_ext(&pnode_ext, mod, nodeid->name[i])) {
                return 0;
            }
        }
    }

    if (ctx_node && (ctx_node != parent)) {
        /* descendant path has not finished in the context node */
        return 0;
    } else if (!ctx_node && (parent || pnode_ext)) {
        /* some parent/extension was not matched */
        return 0;
    }

    return 1;
}